

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O1

Dec_Graph_t *
Abc_NodeRefactor(Abc_ManRef_t *p,Abc_Obj_t *pNode,Vec_Ptr_t *vFanins,int fUpdateLevel,int fUseZeros,
                int fUseDcs,int fVerbose)

{
  void **ppvVar1;
  Abc_Ntk_t *pAVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  word *pTruth;
  ulong uVar7;
  Dec_Graph_t *pDVar8;
  Kit_Graph_t *pGraph;
  int *piVar9;
  long lVar10;
  long lVar11;
  int nWords;
  uint uVar12;
  ulong uVar13;
  timespec local_50;
  Abc_Obj_t *local_40;
  int local_38;
  int local_34;
  
  iVar6 = vFanins->nSize;
  iVar5 = 1 << ((char)p->nNodeSizeMax - 6U & 0x1f);
  if (p->nNodeSizeMax < 7) {
    iVar5 = 1;
  }
  p->nNodesConsidered = p->nNodesConsidered + 1;
  if (fUpdateLevel == 0) {
    local_38 = 1000000000;
  }
  else {
    local_38 = Abc_ObjRequiredLevel(pNode);
  }
  local_40 = pNode;
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  pTruth = Abc_NodeConeTruth(p->vVars,p->vFuncs,iVar5,local_40,vFanins,p->vVisited);
  iVar5 = clock_gettime(3,&local_50);
  if (iVar5 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p->timeTru = p->timeTru + lVar11 + lVar10;
  if (pTruth == (word *)0x0) {
    return (Dec_Graph_t *)0x0;
  }
  uVar12 = 1 << ((char)iVar6 - 6U & 0x1f);
  if (iVar6 < 7) {
    uVar12 = 1;
  }
  uVar13 = (ulong)uVar12;
  local_34 = fUseZeros;
  if (0 < (int)uVar12) {
    uVar7 = 0;
    do {
      if (pTruth[uVar7] != 0) {
        if (0 < (int)uVar12) {
          uVar7 = 0;
          do {
            if (pTruth[uVar7] != 0xffffffffffffffff) {
              iVar5 = clock_gettime(3,&local_50);
              if (iVar5 < 0) {
                lVar10 = 1;
              }
              else {
                lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
              }
              pGraph = Kit_TruthToGraph((uint *)pTruth,iVar6,p->vMemory);
              iVar6 = clock_gettime(3,&local_50);
              if (iVar6 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
              }
              p->timeFact = p->timeFact + lVar11 + lVar10;
              iVar6 = vFanins->nSize;
              if (0 < (long)iVar6) {
                ppvVar1 = vFanins->pArray;
                lVar10 = 0;
                do {
                  piVar9 = (int *)((long)ppvVar1[lVar10] + 0x2c);
                  *piVar9 = *piVar9 + 1;
                  lVar10 = lVar10 + 1;
                } while (iVar6 != lVar10);
              }
              pAVar2 = local_40->pNtk;
              if ((pAVar2->vTravIds).pArray == (int *)0x0) {
                iVar6 = pAVar2->vObjs->nSize;
                uVar13 = (long)iVar6 + 500;
                iVar5 = (int)uVar13;
                if ((pAVar2->vTravIds).nCap < iVar5) {
                  piVar9 = (int *)malloc(uVar13 * 4);
                  (pAVar2->vTravIds).pArray = piVar9;
                  if (piVar9 == (int *)0x0) {
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  (pAVar2->vTravIds).nCap = iVar5;
                }
                if (-500 < iVar6) {
                  memset((pAVar2->vTravIds).pArray,0,(uVar13 & 0xffffffff) << 2);
                }
                (pAVar2->vTravIds).nSize = iVar5;
              }
              iVar6 = pAVar2->nTravIds;
              pAVar2->nTravIds = iVar6 + 1;
              if (iVar6 < 0x3fffffff) {
                iVar6 = Abc_NodeMffcLabelAig(local_40);
                if (0 < vFanins->nSize) {
                  lVar10 = 1;
                  lVar11 = 0;
                  do {
                    pvVar3 = vFanins->pArray[lVar11];
                    piVar9 = (int *)((long)pvVar3 + 0x2c);
                    *piVar9 = *piVar9 + -1;
                    *(void **)(&pGraph->pNodes->eEdge0 + lVar10 * 2) = pvVar3;
                    lVar11 = lVar11 + 1;
                    lVar10 = lVar10 + 3;
                  } while (lVar11 < vFanins->nSize);
                }
                iVar5 = clock_gettime(3,&local_50);
                if (iVar5 < 0) {
                  lVar10 = 1;
                }
                else {
                  lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
                  lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_50.tv_sec * -1000000;
                }
                iVar5 = Dec_GraphToNetworkCount(local_40,(Dec_Graph_t *)pGraph,iVar6,local_38);
                iVar4 = clock_gettime(3,&local_50);
                if (iVar4 < 0) {
                  lVar11 = -1;
                }
                else {
                  lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
                }
                p->timeEval = p->timeEval + lVar11 + lVar10;
                if ((iVar5 != -1) && ((local_34 != 0 || (iVar6 != iVar5)))) {
                  p->nLastGain = iVar6 - iVar5;
                  p->nNodesGained = p->nNodesGained + (iVar6 - iVar5);
                  p->nNodesRefactored = p->nNodesRefactored + 1;
                  return (Dec_Graph_t *)pGraph;
                }
                if (pGraph->pNodes != (Kit_Node_t *)0x0) {
                  free(pGraph->pNodes);
                  pGraph->pNodes = (Kit_Node_t *)0x0;
                }
                if (pGraph == (Kit_Graph_t *)0x0) {
                  return (Dec_Graph_t *)0x0;
                }
                free(pGraph);
                return (Dec_Graph_t *)0x0;
              }
              __assert_fail("p->nTravIds < (1<<30)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
            }
            uVar7 = uVar7 + 1;
          } while (uVar13 != uVar7);
        }
        break;
      }
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
  }
  iVar6 = Abc_NodeMffcSize(local_40);
  p->nNodesGained = p->nNodesGained + iVar6;
  p->nNodesRefactored = p->nNodesRefactored + 1;
  p->nLastGain = iVar6;
  if (0 < (int)uVar12) {
    uVar7 = 0;
    do {
      if (pTruth[uVar7] != 0) {
        pDVar8 = (Dec_Graph_t *)malloc(0x20);
        pDVar8->fConst = 0;
        pDVar8->nLeaves = 0;
        pDVar8->nSize = 0;
        pDVar8->nCap = 0;
        pDVar8->pNodes = (Dec_Node_t *)0x0;
        *(undefined8 *)&pDVar8->eRoot = 0;
        pDVar8->fConst = 1;
        return pDVar8;
      }
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
  }
  pDVar8 = (Dec_Graph_t *)malloc(0x20);
  pDVar8->fConst = 0;
  pDVar8->nLeaves = 0;
  pDVar8->nSize = 0;
  pDVar8->nCap = 0;
  pDVar8->pNodes = (Dec_Node_t *)0x0;
  *(undefined8 *)&pDVar8->eRoot = 0;
  pDVar8->fConst = 1;
  *(byte *)&pDVar8->eRoot = *(byte *)&pDVar8->eRoot | 1;
  return pDVar8;
}

Assistant:

Dec_Graph_t * Abc_NodeRefactor( Abc_ManRef_t * p, Abc_Obj_t * pNode, Vec_Ptr_t * vFanins, int fUpdateLevel, int fUseZeros, int fUseDcs, int fVerbose )
{
    extern int    Dec_GraphToNetworkCount( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int NodeMax, int LevelMax );
    int fVeryVerbose = 0;
    int nVars = Vec_PtrSize(vFanins);
    int nWordsMax = Abc_Truth6WordNum(p->nNodeSizeMax);
    Dec_Graph_t * pFForm;
    Abc_Obj_t * pFanin;
    word * pTruth;
    abctime clk;
    int i, nNodesSaved, nNodesAdded, Required;

    p->nNodesConsidered++;

    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the function of the cut
clk = Abc_Clock();
    pTruth = Abc_NodeConeTruth( p->vVars, p->vFuncs, nWordsMax, pNode, vFanins, p->vVisited );
p->timeTru += Abc_Clock() - clk;
    if ( pTruth == NULL )
        return NULL;

    // always accept the case of constant node
    if ( Abc_NodeConeIsConst0(pTruth, nVars) || Abc_NodeConeIsConst1(pTruth, nVars) )
    {
        p->nLastGain = Abc_NodeMffcSize( pNode );
        p->nNodesGained += p->nLastGain;
        p->nNodesRefactored++;
        return Abc_NodeConeIsConst0(pTruth, nVars) ? Dec_GraphCreateConst0() : Dec_GraphCreateConst1();
    }

    // get the factored form
clk = Abc_Clock();
    pFForm = (Dec_Graph_t *)Kit_TruthToGraph( (unsigned *)pTruth, nVars, p->vMemory );
p->timeFact += Abc_Clock() - clk;

    // mark the fanin boundary 
    // (can mark only essential fanins, belonging to bNodeFunc!)
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
        pFanin->vFanouts.nSize++;
    // label MFFC with current traversal ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    nNodesSaved = Abc_NodeMffcLabelAig( pNode );
    // unmark the fanin boundary and set the fanins as leaves in the form
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pFanin, i )
    {
        pFanin->vFanouts.nSize--;
        Dec_GraphNode(pFForm, i)->pFunc = pFanin;
    }

    // detect how many new nodes will be added (while taking into account reused nodes)
clk = Abc_Clock();
    nNodesAdded = Dec_GraphToNetworkCount( pNode, pFForm, nNodesSaved, Required );
p->timeEval += Abc_Clock() - clk;
    // quit if there is no improvement
    if ( nNodesAdded == -1 || (nNodesAdded == nNodesSaved && !fUseZeros) )
    {
        Dec_GraphFree( pFForm );
        return NULL;
    }

    // compute the total gain in the number of nodes
    p->nLastGain = nNodesSaved - nNodesAdded;
    p->nNodesGained += p->nLastGain;
    p->nNodesRefactored++;

    // report the progress
    if ( fVeryVerbose )
    {
        printf( "Node %6s : ",  Abc_ObjName(pNode) );
        printf( "Cone = %2d. ", vFanins->nSize );
        printf( "FF = %2d. ",   1 + Dec_GraphNodeNum(pFForm) );
        printf( "MFFC = %2d. ", nNodesSaved );
        printf( "Add = %2d. ",  nNodesAdded );
        printf( "GAIN = %2d. ", p->nLastGain );
        printf( "\n" );
    }
    return pFForm;
}